

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O2

void __thiscall bloaty::RangeMapTest_Bug1_Test::TestBody(RangeMapTest_Bug1_Test *this)

{
  RangeMap *this_00;
  long lVar1;
  initializer_list<bloaty::RangeMapTest::Entry> __l;
  allocator_type local_9b;
  allocator<char> local_9a;
  allocator<char> local_99;
  vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> local_98;
  undefined1 local_80 [24];
  string local_68 [32];
  undefined8 local_48;
  undefined8 local_40;
  uint64_t local_38;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,"foo",(allocator<char> *)&local_98);
  this_00 = &(this->super_RangeMapTest).map_;
  RangeMap::AddRange(this_00,100,0x14,(string *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,"bar",(allocator<char> *)&local_98);
  RangeMap::AddRange(this_00,0x78,0x14,(string *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,"baz",(allocator<char> *)&local_98);
  RangeMap::AddRange(this_00,100,0xf,(string *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  local_80._0_8_ = (pointer)0x64;
  local_80._8_8_ = 0x78;
  local_80._16_8_ = (this->super_RangeMapTest).kNoTranslation;
  std::__cxx11::string::string<std::allocator<char>>(local_68,"foo",&local_99);
  local_48 = 0x78;
  local_40 = 0x8c;
  local_38 = (this->super_RangeMapTest).kNoTranslation;
  std::__cxx11::string::string<std::allocator<char>>(local_30,"bar",&local_9a);
  __l._M_len = 2;
  __l._M_array = (iterator)local_80;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            (&local_98,__l,&local_9b);
  RangeMapTest::AssertMainMapEquals(&this->super_RangeMapTest,&local_98);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            (&local_98);
  lVar1 = 0x50;
  do {
    std::__cxx11::string::~string((string *)(local_80 + lVar1));
    lVar1 = lVar1 + -0x38;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

TEST_F(RangeMapTest, Bug1) {
  map_.AddRange(100, 20, "foo");
  map_.AddRange(120, 20, "bar");
  map_.AddRange(100, 15, "baz");
  AssertMainMapEquals({
    {100, 120, kNoTranslation, "foo"},
    {120, 140, kNoTranslation, "bar"},
  });
}